

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lutf8lib.c
# Opt level: O1

int utflen(lua_State *L)

{
  lua_State *L_00;
  int iVar1;
  char *pcVar2;
  long lVar3;
  lua_Integer lVar4;
  char *pcVar5;
  long lVar6;
  size_t len;
  ulong local_48;
  lua_State *local_40;
  long local_38;
  
  pcVar2 = luaL_checklstring(L,1,&local_48);
  lVar3 = luaL_optinteger(L,2,1);
  if (lVar3 < 0) {
    if (local_48 < (ulong)-lVar3) {
      lVar3 = 0;
    }
    else {
      lVar3 = lVar3 + local_48 + 1;
    }
  }
  lVar4 = luaL_optinteger(L,3,-1);
  if (lVar4 < 0) {
    if (local_48 < (ulong)-lVar4) {
      lVar4 = 0;
    }
    else {
      lVar4 = lVar4 + local_48 + 1;
    }
  }
  iVar1 = lua_toboolean(L,4);
  lVar6 = lVar3 + -1;
  if ((lVar3 < 1) || (lVar3 = lVar6, (long)local_48 < lVar6)) {
    lVar6 = lVar3;
    luaL_argerror(L,2,"initial position out of bounds");
  }
  if ((long)local_48 < lVar4) {
    luaL_argerror(L,3,"final position out of bounds");
  }
  local_38 = 0;
  local_40 = L;
  while( true ) {
    if (lVar4 <= lVar6) {
      lua_pushinteger(local_40,local_38);
      return 1;
    }
    pcVar5 = utf8_decode(pcVar2 + lVar6,(l_uint32 *)0x0,(uint)(iVar1 == 0));
    L_00 = local_40;
    if (pcVar5 == (char *)0x0) break;
    lVar6 = (long)pcVar5 - (long)pcVar2;
    local_38 = local_38 + 1;
  }
  lua_pushnil(local_40);
  lua_pushinteger(L_00,lVar6 + 1);
  return 2;
}

Assistant:

static int utflen (lua_State *L) {
  lua_Integer n = 0;  /* counter for the number of characters */
  size_t len;  /* string length in bytes */
  const char *s = luaL_checklstring(L, 1, &len);
  lua_Integer posi = u_posrelat(luaL_optinteger(L, 2, 1), len);
  lua_Integer posj = u_posrelat(luaL_optinteger(L, 3, -1), len);
  int lax = lua_toboolean(L, 4);
  luaL_argcheck(L, 1 <= posi && --posi <= (lua_Integer)len, 2,
                   "initial position out of bounds");
  luaL_argcheck(L, --posj < (lua_Integer)len, 3,
                   "final position out of bounds");
  while (posi <= posj) {
    const char *s1 = utf8_decode(s + posi, NULL, !lax);
    if (s1 == NULL) {  /* conversion error? */
      luaL_pushfail(L);  /* return fail ... */
      lua_pushinteger(L, posi + 1);  /* ... and current position */
      return 2;
    }
    posi = ct_diff2S(s1 - s);
    n++;
  }
  lua_pushinteger(L, n);
  return 1;
}